

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  uint length_00;
  uint8_t *puVar2;
  int32_t *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  UBool *pUVar7;
  UBool UVar8;
  uint uVar9;
  int length_01;
  int32_t iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  UnicodeSet *this_00;
  long lVar18;
  uint8_t *t;
  uint8_t *s_00;
  uint uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint local_cc;
  OffsetList offsets;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar10 = spanNotUTF8(this,s,length);
    return iVar10;
  }
  this_00 = &this->spanSet;
  uVar9 = UnicodeSet::spanUTF8(this_00,(char *)s,length,USET_SPAN_CONTAINED);
  length_01 = length - uVar9;
  if (length_01 == 0) {
    return length;
  }
  offsets.list = offsets.staticList;
  offsets.capacity = 0;
  offsets.length = 0;
  offsets.start = 0;
  if (spanCondition == USET_SPAN_CONTAINED) {
    OffsetList::setMaxLength(&offsets,this->maxLength8);
  }
  uVar15 = this->strings->count;
  uVar16 = 0;
  lVar18 = 0;
  if (this->all != '\0') {
    lVar18 = (long)(int)uVar15 * 2;
  }
  puVar2 = this->spanLengths;
  local_cc = uVar9;
  if (0 < (int)uVar15) {
    uVar16 = (ulong)uVar15;
  }
  do {
    t = this->utf8;
    lVar17 = (long)(int)uVar9;
    uVar15 = length;
    if (spanCondition == USET_SPAN_CONTAINED) {
      for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
        iVar23 = this->utf8Lengths[uVar14];
        lVar20 = (long)iVar23;
        if (lVar20 != 0) {
          bVar1 = puVar2[uVar14 + lVar18];
          uVar11 = (uint)bVar1;
          if (bVar1 == 0xff) {
            t = t + lVar20;
          }
          else {
            if ((bVar1 == 0xfe) && (uVar11 = iVar23 - 1, (char)t[lVar20 + -1] < -0x40)) {
              uVar11 = utf8_back1SafeBody_63(t,0,uVar11);
            }
            if ((int)local_cc <= (int)uVar11) {
              uVar11 = local_cc;
            }
            iVar22 = iVar23 - uVar11;
            lVar5 = lVar17 - (int)uVar11;
            for (lVar21 = 0; pUVar7 = offsets.list, iVar4 = (int)lVar21, iVar22 + iVar4 <= length_01
                ; lVar21 = lVar21 + 1) {
              if (-0x41 < (char)s[lVar21 + lVar5]) {
                iVar12 = 0;
                if (offsets.capacity <= iVar22 + iVar4 + offsets.start) {
                  iVar12 = offsets.capacity;
                }
                lVar6 = (long)iVar22 + ((long)offsets.start - (long)iVar12);
                if ((offsets.list[lVar21 + lVar6] == '\0') &&
                   (UVar8 = matches8(s + lVar21 + lVar5,t,iVar23), UVar8 != '\0')) {
                  if ((length_01 + uVar11) - iVar23 == iVar4) goto LAB_00180b7f;
                  pUVar7[lVar21 + lVar6] = '\x01';
                  offsets.length = offsets.length + 1;
                }
              }
              if ((int)uVar11 == lVar21) break;
            }
            t = t + lVar20;
          }
        }
      }
LAB_00180aab:
      if ((local_cc == 0) && (uVar9 != 0)) {
        if (offsets.length == 0) {
          uVar11 = UnicodeSet::spanUTF8(this_00,(char *)(s + lVar17),length_01,USET_SPAN_CONTAINED);
          length_01 = length_01 - uVar11;
          if ((length_01 != 0) && (local_cc = uVar11, uVar11 != 0)) goto LAB_00180b73;
          uVar15 = uVar11 + uVar9;
LAB_00180b7f:
          OffsetList::~OffsetList(&offsets);
          return uVar15;
        }
        uVar11 = spanOneUTF8(this_00,s + lVar17,length_01);
        if ((int)uVar11 < 1) goto LAB_00180b05;
        length_01 = length_01 - uVar11;
        if (length_01 == 0) goto LAB_00180b7f;
        OffsetList::shift(&offsets,uVar11);
      }
      else {
        uVar15 = uVar9;
        if (offsets.length == 0) goto LAB_00180b7f;
LAB_00180b05:
        uVar11 = OffsetList::popMinimum(&offsets);
        length_01 = length_01 - uVar11;
      }
      local_cc = 0;
    }
    else {
      piVar3 = this->utf8Lengths;
      uVar11 = 0;
      iVar23 = 0;
      for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
        length_00 = piVar3[uVar14];
        if ((long)(int)length_00 != 0) {
          uVar13 = (uint)puVar2[uVar14 + lVar18];
          if (0xfd < uVar13) {
            uVar13 = length_00;
          }
          if ((int)local_cc <= (int)uVar13) {
            uVar13 = local_cc;
          }
          uVar19 = length_00 - uVar13;
          lVar20 = (long)(int)uVar13;
          s_00 = s + (lVar17 - lVar20);
          while( true ) {
            if ((length_01 < (int)uVar19) || (lVar20 < iVar23)) goto LAB_00180a7d;
            if ((-0x41 < (char)*s_00) &&
               (((iVar23 < lVar20 || ((int)uVar11 < (int)uVar19)) &&
                (UVar8 = matches8(s_00,t,length_00), UVar8 != '\0')))) break;
            lVar20 = lVar20 + -1;
            uVar19 = uVar19 + 1;
            s_00 = s_00 + 1;
          }
          iVar23 = (int)lVar20;
          uVar11 = uVar19;
LAB_00180a7d:
          t = t + (int)length_00;
        }
      }
      if (iVar23 == 0 && uVar11 == 0) goto LAB_00180aab;
      local_cc = 0;
      length_01 = length_01 - uVar11;
      if (length_01 == 0) goto LAB_00180b7f;
    }
LAB_00180b73:
    uVar9 = uVar9 + uVar11;
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotUTF8(s, length);
    }
    int32_t spanLength=spanSet.spanUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    U8_BACK_1(s8, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            !offsets.containsOffset(inc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length8-overlap;  // Keep overlap+inc==length8.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if(!U8_IS_TRAIL(s[pos-overlap]) &&
                            (overlap>maxOverlap ||
                                /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                            matches8(s+pos-overlap, s8, length8)) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
                s8+=length8;
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.spanUTF8((const char *)s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneUTF8(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}